

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

SampledSpectrum __thiscall
pbrt::SimplePathIntegrator::Li
          (SimplePathIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,
          SamplerHandle *sampler,ScratchBuffer *scratchBuffer,VisibleSurface *visibleSurface)

{
  size_t sVar1;
  ulong uVar2;
  pointer pLVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Vector3f wiRender;
  Interval<float> IVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined8 uVar11;
  undefined1 auVar12 [20];
  bool bVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  SamplerHandle *pSVar18;
  pointer pLVar19;
  PrimitiveHandle *this_00;
  DebugMLTSampler *pDVar20;
  long in_FS_OFFSET;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  Float FVar25;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar26;
  float fVar27;
  undefined1 auVar33 [16];
  undefined4 extraout_XMM0_Dc;
  undefined8 uVar72;
  undefined1 auVar73 [56];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar45 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd_02;
  undefined1 auVar70 [64];
  undefined8 uVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined8 uVar87;
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined4 uVar89;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 in_ZMM6 [64];
  Vector3f woRender;
  Vector3f woRender_00;
  Vector3f woRender_01;
  SampledSpectrum SVar92;
  Vector3f wiRender_00;
  undefined1 local_388 [16];
  DispatchSplit<9> local_369;
  SampledSpectrum f;
  Tuple3<pbrt::Vector3,_float> local_358;
  float fStack_34c;
  undefined8 uStack_348;
  undefined8 local_340;
  int local_32c;
  SampledSpectrum beta;
  undefined1 local_318 [16];
  float local_308;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined4 local_2dc;
  undefined1 local_2d8 [16];
  float local_2c8;
  float fStack_2c4;
  undefined4 uStack_2c0;
  undefined4 uStack_2bc;
  Interval<float> *local_2b8;
  SamplerHandle *local_2b0;
  PrimitiveHandle *local_2a8;
  SimplePathIntegrator *local_2a0;
  LightLiSample ls;
  SamplerHandle local_218;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_210;
  undefined8 local_208;
  TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
  local_200;
  anon_struct_8_0_00000001_for___align local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  SampledSpectrum *local_1c8;
  undefined8 *puStack_1c0;
  undefined8 *puStack_1b8;
  undefined4 *puStack_1b0;
  BSDF bsdf;
  optional<pbrt::ShapeIntersection> si;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 auVar46 [64];
  undefined1 auVar71 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 extraout_var_10 [56];
  undefined1 extraout_var_11 [56];
  undefined1 extraout_var_12 [56];
  undefined1 extraout_var_13 [56];
  undefined1 extraout_var_14 [56];
  undefined1 extraout_var_15 [56];
  undefined1 extraout_var_16 [56];
  undefined1 extraout_var_17 [56];
  undefined1 extraout_var_18 [56];
  undefined1 extraout_var_19 [56];
  undefined1 extraout_var_20 [56];
  undefined1 extraout_var_21 [56];
  undefined1 extraout_var_22 [56];
  undefined1 extraout_var_23 [56];
  undefined1 extraout_var_24 [56];
  undefined1 extraout_var_25 [56];
  undefined1 extraout_var_26 [56];
  undefined1 extraout_var_27 [56];
  undefined1 extraout_var_28 [56];
  undefined1 extraout_var_29 [56];
  undefined1 extraout_var_30 [56];
  undefined1 auVar81 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar88 [56];
  
  this_00 = &(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.aggregate;
  iVar14 = 0;
  beta.values.values[0] = 1.0;
  beta.values.values[1] = 1.0;
  beta.values.values[2] = 1.0;
  beta.values.values[3] = 1.0;
  local_2b8 = (Interval<float> *)&ray->hasDifferentials;
  _local_2f8 = ZEXT816(0);
  local_388._0_4_ = 1;
  local_2b0 = sampler;
  local_2a8 = this_00;
  local_2a0 = this;
  do {
    if ((beta.values.values[0] == 0.0) && (!NAN(beta.values.values[0]))) {
      uVar16 = 0xffffffffffffffff;
      do {
        if (uVar16 == 2) goto LAB_0042abfc;
        fVar27 = beta.values.values[uVar16 + 2];
        uVar16 = uVar16 + 1;
      } while ((fVar27 == 0.0) && (!NAN(fVar27)));
      if (2 < uVar16) break;
    }
    *(long *)(in_FS_OFFSET + -0x2d8) = *(long *)(in_FS_OFFSET + -0x2d8) + 1;
    if (((this_00->
         super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
         ).bits & 0xffffffffffff) == 0) {
      si.optionalValue._0_64_ = ZEXT464(0) << 0x20;
      si.set = false;
      si._257_7_ = 0;
      si.optionalValue._64_64_ = si.optionalValue._0_64_;
      si.optionalValue._128_64_ = si.optionalValue._0_64_;
      si.optionalValue._192_64_ = si.optionalValue._0_64_;
LAB_00429efd:
      if ((this->sampleLights != true) ||
         ((local_388 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
        pLVar19 = (this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                  infiniteLights.
                  super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pLVar3 = *(pointer *)
                  ((long)&(this->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
                          infiniteLights.
                          super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>.
                          _M_impl.super__Vector_impl_data + 8);
        while (this_00 = local_2a8, this = local_2a0, pLVar19 != pLVar3) {
          uVar16 = (pLVar19->
                   super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                   ).bits;
          auVar22 = ZEXT816(0) << 0x40;
          auVar24 = ZEXT816(0) << 0x40;
          uVar15 = (uint)(ushort)(uVar16 >> 0x30);
          if (6 < uVar15) {
            uVar15 = uVar15 - 6;
            auVar22 = in_ZMM6._0_16_;
            if (uVar15 < 2) {
              auVar73 = ZEXT856(0);
              auVar88 = ZEXT856(0);
              in_ZMM6 = ZEXT1664(auVar22);
              SVar92 = UniformInfiniteLight::Le
                                 ((UniformInfiniteLight *)(uVar16 & 0xffffffffffff),&ray->super_Ray,
                                  lambda);
              auVar82._0_8_ = SVar92.values.values._8_8_;
              auVar82._8_56_ = auVar88;
              auVar24 = auVar82._0_16_;
              auVar36._0_8_ = SVar92.values.values._0_8_;
              auVar36._8_56_ = auVar73;
              auVar22 = auVar36._0_16_;
            }
            else if (uVar15 == 2) {
              auVar73 = ZEXT856(0);
              auVar88 = ZEXT856(0);
              in_ZMM6 = ZEXT1664(auVar22);
              SVar92 = ImageInfiniteLight::Le
                                 ((ImageInfiniteLight *)(uVar16 & 0xffffffffffff),&ray->super_Ray,
                                  lambda);
              auVar83._0_8_ = SVar92.values.values._8_8_;
              auVar83._8_56_ = auVar88;
              auVar24 = auVar83._0_16_;
              auVar37._0_8_ = SVar92.values.values._0_8_;
              auVar37._8_56_ = auVar73;
              auVar22 = auVar37._0_16_;
            }
            else {
              auVar73 = ZEXT856(0);
              auVar88 = ZEXT856(0);
              in_ZMM6 = ZEXT1664(auVar22);
              SVar92 = PortalImageInfiniteLight::Le
                                 ((PortalImageInfiniteLight *)(uVar16 & 0xffffffffffff),
                                  &ray->super_Ray,lambda);
              auVar84._0_8_ = SVar92.values.values._8_8_;
              auVar84._8_56_ = auVar88;
              auVar24 = auVar84._0_16_;
              auVar38._0_8_ = SVar92.values.values._0_8_;
              auVar38._8_56_ = auVar73;
              auVar22 = auVar38._0_16_;
            }
          }
          auVar22 = vmovlhps_avx(auVar22,auVar24);
          auVar24._0_4_ = auVar22._0_4_ * beta.values.values[0];
          auVar24._4_4_ = auVar22._4_4_ * beta.values.values[1];
          auVar24._8_4_ = auVar22._8_4_ * beta.values.values[2];
          auVar24._12_4_ = auVar22._12_4_ * beta.values.values[3];
          auVar22 = *(undefined1 (*) [16])(lambda->pdf).values;
          pLVar19 = pLVar19 + 1;
          uVar16 = vcmpps_avx512vl(auVar22,_DAT_004fb010,4);
          auVar22 = vdivps_avx512vl(auVar24,auVar22);
          local_2f8._0_4_ =
               (float)((uint)((byte)uVar16 & 1) * auVar22._0_4_) + (float)local_2f8._0_4_;
          local_2f8._4_4_ =
               (float)((uint)((byte)(uVar16 >> 1) & 1) * auVar22._4_4_) + (float)local_2f8._4_4_;
          fStack_2f0 = (float)((uint)((byte)(uVar16 >> 2) & 1) * auVar22._8_4_) + fStack_2f0;
          fStack_2ec = (float)((uint)((byte)(uVar16 >> 3) & 1) * auVar22._12_4_) + fStack_2ec;
        }
      }
      bVar13 = true;
    }
    else {
      in_ZMM6 = ZEXT1664(in_ZMM6._0_16_);
      PrimitiveHandle::Intersect(&si,this_00,&ray->super_Ray,INFINITY);
      if ((si._256_8_ & 1) == 0) goto LAB_00429efd;
      if ((this->sampleLights != true) ||
         ((local_388 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
        uVar16._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
        uVar16._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar22._0_8_ = uVar16 ^ 0x8000000080000000;
        auVar22._8_4_ = 0x80000000;
        auVar22._12_4_ = 0x80000000;
        auVar73 = ZEXT856(auVar22._8_8_);
        auVar75._0_4_ = -(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar75._4_4_ = 0x80000000;
        auVar75._8_4_ = 0x80000000;
        auVar75._12_4_ = 0x80000000;
        auVar88 = ZEXT856(auVar75._8_8_);
        ls.L.values.values._0_8_ = vmovlps_avx(auVar22);
        ls.L.values.values[2] = auVar75._0_4_;
        SVar92 = SurfaceInteraction::Le((SurfaceInteraction *)&si,(Vector3f *)&ls,lambda);
        auVar81._0_8_ = SVar92.values.values._8_8_;
        auVar81._8_56_ = auVar88;
        auVar34._0_8_ = SVar92.values.values._0_8_;
        auVar34._8_56_ = auVar73;
        auVar22 = vmovlhps_avx(auVar34._0_16_,auVar81._0_16_);
        auVar23._0_4_ = auVar22._0_4_ * beta.values.values[0];
        auVar23._4_4_ = auVar22._4_4_ * beta.values.values[1];
        auVar23._8_4_ = auVar22._8_4_ * beta.values.values[2];
        auVar23._12_4_ = auVar22._12_4_ * beta.values.values[3];
        auVar22 = *(undefined1 (*) [16])(lambda->pdf).values;
        uVar16 = vcmpps_avx512vl(auVar22,_DAT_004fb010,4);
        auVar22 = vdivps_avx512vl(auVar23,auVar22);
        local_2f8._0_4_ = (float)((uint)((byte)uVar16 & 1) * auVar22._0_4_) + (float)local_2f8._0_4_
        ;
        local_2f8._4_4_ =
             (float)((uint)((byte)(uVar16 >> 1) & 1) * auVar22._4_4_) + (float)local_2f8._4_4_;
        fStack_2f0 = (float)((uint)((byte)(uVar16 >> 2) & 1) * auVar22._8_4_) + fStack_2f0;
        fStack_2ec = (float)((uint)((byte)(uVar16 >> 3) & 1) * auVar22._12_4_) + fStack_2ec;
      }
      pSVar18 = local_2b0;
      local_32c = iVar14 + 1;
      bVar13 = true;
      bVar21 = iVar14 != this->maxDepth;
      iVar14 = local_32c;
      if (bVar21) {
        local_210.bits =
             (this->super_RayIntegrator).super_ImageTileIntegrator.camera.
             super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
             .bits;
        local_218.
        super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
        .bits = (TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                 )(local_2b0->
                  super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                  ).bits;
        SurfaceInteraction::GetBSDF
                  (&bsdf,(SurfaceInteraction *)&si,ray,lambda,(CameraHandle *)&local_210,
                   scratchBuffer,&local_218);
        if (((ulong)bsdf.bxdf.
                    super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                    .bits & 0xffffffffffff) == 0) {
          if (si.set == false) {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
          }
          SurfaceInteraction::SkipIntersection
                    ((SurfaceInteraction *)&si,ray,(Float)si.optionalValue._248_4_);
        }
        else {
          local_2c8 = -(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
          fStack_2c4 = -(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
          uStack_2c0 = 0x80000000;
          uStack_2bc = 0x80000000;
          local_2d8._0_4_ = -(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
          local_2d8._4_4_ = 0x80000000;
          local_2d8._8_4_ = 0x80000000;
          local_2d8._12_4_ = 0x80000000;
          if (this->sampleLights == true) {
            ls.L.values.values._0_8_ =
                 (pSVar18->
                 super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                 ).bits;
            FVar25 = detail::DispatchSplit<8>::operator()
                               ((DispatchSplit<8> *)&f,&ls,(ulong)ls.L.values.values._0_8_ >> 0x30);
            auVar22 = in_ZMM6._0_16_;
            sVar1 = (this->lightSampler).lights.nStored;
            if (sVar1 != 0) {
              auVar24 = vcvtusi2ss_avx512f(auVar22,sVar1);
              iVar14 = (int)sVar1 + -1;
              uVar16 = (pSVar18->
                       super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                       ).bits;
              iVar17 = (int)(FVar25 * auVar24._0_4_);
              if (iVar17 <= iVar14) {
                iVar14 = iVar17;
              }
              uVar2 = (this->lightSampler).lights.ptr[iVar14].
                      super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                      .bits;
              uVar15 = (uint)(ushort)(uVar16 >> 0x30);
              if (uVar16 < 0x5000000000000) {
                if (uVar15 < 3) {
                  if (uVar15 == 2) {
                    auVar35._0_8_ =
                         PaddedSobolSampler::Get2D((PaddedSobolSampler *)(uVar16 & 0xffffffffffff));
                    auVar35._8_56_ = extraout_var_03;
                    auVar23 = auVar35._0_16_;
                  }
                  else {
                    auVar42._0_8_ = HaltonSampler::Get2D((HaltonSampler *)(uVar16 & 0xffffffffffff))
                    ;
                    auVar42._8_56_ = extraout_var_07;
                    auVar23 = auVar42._0_16_;
                  }
                }
                else if ((uVar15 & 6) == 2) {
                  auVar40._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)(uVar16 & 0xffffffffffff))
                  ;
                  auVar40._8_56_ = extraout_var_05;
                  auVar23 = auVar40._0_16_;
                }
                else {
                  auVar44._0_8_ = RandomSampler::Get2D((RandomSampler *)(uVar16 & 0xffffffffffff));
                  auVar44._8_56_ = extraout_var_09;
                  auVar23 = auVar44._0_16_;
                }
              }
              else {
                uVar15 = uVar15 - 4;
                if (uVar15 < 3) {
                  if (uVar15 == 2) {
                    auVar39._0_8_ =
                         StratifiedSampler::Get2D((StratifiedSampler *)(uVar16 & 0xffffffffffff));
                    auVar39._8_56_ = extraout_var_04;
                    auVar23 = auVar39._0_16_;
                  }
                  else {
                    auVar43._0_8_ = SobolSampler::Get2D((SobolSampler *)(uVar16 & 0xffffffffffff));
                    auVar43._8_56_ = extraout_var_08;
                    auVar23 = auVar43._0_16_;
                  }
                }
                else {
                  pDVar20 = (DebugMLTSampler *)(uVar16 & 0xffffffffffff);
                  if ((uVar15 & 0x7ffffffe) == 2) {
                    auVar41._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar20);
                    auVar41._8_56_ = extraout_var_06;
                    auVar23 = auVar41._0_16_;
                  }
                  else {
                    local_318._0_4_ = DebugMLTSampler::Get1D(pDVar20);
                    local_318._4_4_ = extraout_XMM0_Db;
                    local_318._8_4_ = extraout_XMM0_Dc;
                    local_318._12_4_ = extraout_XMM0_Dd;
                    auVar45._0_4_ = DebugMLTSampler::Get1D(pDVar20);
                    auVar45._4_60_ = extraout_var;
                    auVar23 = vinsertps_avx(local_318,auVar45._0_16_,0x10);
                  }
                }
              }
              auVar38 = si.optionalValue._0_64_;
              uVar89 = si.optionalValue._48_4_;
              uVar72 = si.optionalValue._40_8_;
              local_1e8 = si.optionalValue._16_8_;
              local_1f8 = si.optionalValue.__align;
              uStack_1f0 = si.optionalValue._8_8_;
              uStack_1d8 = si.optionalValue._48_4_;
              local_1e0 = si.optionalValue._40_8_;
              uStack_1cc = si.optionalValue._136_4_;
              uStack_1d4 = si.optionalValue._128_4_;
              uStack_1d0 = si.optionalValue._132_4_;
              local_58 = *(undefined8 *)(lambda->lambda).values;
              uStack_50 = *(undefined8 *)((lambda->lambda).values + 2);
              uStack_48 = *(undefined8 *)(lambda->pdf).values;
              uStack_40 = *(undefined8 *)((lambda->pdf).values + 2);
              f.values.values = si.optionalValue._0_16_;
              uStack_348 = CONCAT44(uStack_1d4,si.optionalValue._48_4_);
              local_340 = si.optionalValue._132_8_;
              local_208 = vmovlps_avx(auVar23);
              local_2dc = 1;
              local_1c8 = &f;
              local_358.x = (float)si.optionalValue._16_4_;
              local_358.y = (float)si.optionalValue._20_4_;
              puStack_1c0 = &local_208;
              puStack_1b8 = &local_58;
              puStack_1b0 = &local_2dc;
              local_358.z = (float)si.optionalValue._40_4_;
              fStack_34c = (float)si.optionalValue._44_4_;
              in_ZMM6 = ZEXT1664(auVar22);
              local_200.bits = uVar2;
              si.optionalValue._0_64_ = auVar38;
              detail::DispatchSplit<9>::operator()
                        (&ls,&local_369,&local_200,uVar2 >> 0x30,uVar72,uVar89,local_1c8,puStack_1c0
                         ,puStack_1b8,puStack_1b0);
              fVar27 = ls.wi.super_Tuple3<pbrt::Vector3,_float>.z;
              pSVar18 = local_2b0;
              if (0.0 < ls.pdf) {
                if ((ls.L.values.values[0] == 0.0) && (!NAN(ls.L.values.values[0]))) {
                  uVar16 = 0xffffffffffffffff;
                  do {
                    if (uVar16 == 2) goto LAB_0042a3c4;
                    fVar26 = ls.L.values.values[uVar16 + 2];
                    uVar16 = uVar16 + 1;
                  } while ((fVar26 == 0.0) && (!NAN(fVar26)));
                  if (2 < uVar16) goto LAB_0042a3c4;
                }
                local_318._4_4_ = ls.wi.super_Tuple3<pbrt::Vector3,_float>.y;
                local_318._0_4_ = ls.wi.super_Tuple3<pbrt::Vector3,_float>.x;
                wiRender.super_Tuple3<pbrt::Vector3,_float>.y =
                     ls.wi.super_Tuple3<pbrt::Vector3,_float>.y;
                wiRender.super_Tuple3<pbrt::Vector3,_float>.x =
                     ls.wi.super_Tuple3<pbrt::Vector3,_float>.x;
                wiRender.super_Tuple3<pbrt::Vector3,_float>.z =
                     ls.wi.super_Tuple3<pbrt::Vector3,_float>.z;
                woRender.super_Tuple3<pbrt::Vector3,_float>.y = fStack_2c4;
                woRender.super_Tuple3<pbrt::Vector3,_float>.x = local_2c8;
                local_318._8_8_ = 0;
                woRender.super_Tuple3<pbrt::Vector3,_float>.z = local_2d8._0_4_;
                auVar88 = ZEXT856((ulong)local_2d8._8_8_);
                auVar73 = ZEXT856(CONCAT44(uStack_2bc,uStack_2c0));
                SVar92 = BSDF::f(&bsdf,woRender,wiRender,Radiance);
                auVar85._0_8_ = SVar92.values.values._8_8_;
                auVar85._8_56_ = auVar88;
                auVar46._0_8_ = SVar92.values.values._0_8_;
                auVar46._8_56_ = auVar73;
                auVar22 = vmovlhps_avx(auVar46._0_16_,auVar85._0_16_);
                auVar23 = vmovshdup_avx(local_318);
                auVar75 = ZEXT416((uint)(fVar27 * (float)si.optionalValue._136_4_));
                auVar23 = vfmadd132ss_fma(auVar23,auVar75,ZEXT416((uint)si.optionalValue._132_4_));
                auVar75 = vfmsub213ss_fma(ZEXT416((uint)fVar27),
                                          ZEXT416((uint)si.optionalValue._136_4_),auVar75);
                auVar23 = vfmadd231ss_fma(ZEXT416((uint)(auVar23._0_4_ + auVar75._0_4_)),local_318,
                                          ZEXT416((uint)si.optionalValue._128_4_));
                auVar76._0_4_ = auVar23._0_4_;
                auVar76._4_4_ = auVar76._0_4_;
                auVar76._8_4_ = auVar76._0_4_;
                auVar76._12_4_ = auVar76._0_4_;
                auVar4._8_4_ = 0x7fffffff;
                auVar4._0_8_ = 0x7fffffff7fffffff;
                auVar4._12_4_ = 0x7fffffff;
                auVar23 = vandps_avx512vl(auVar76,auVar4);
                f.values.values[0] = auVar23._0_4_ * auVar22._0_4_;
                f.values.values[1] = auVar23._4_4_ * auVar22._4_4_;
                f.values.values[2] = auVar23._8_4_ * auVar22._8_4_;
                f.values.values[3] = auVar23._12_4_ * auVar22._12_4_;
                if ((f.values.values[0] == 0.0) && (!NAN(f.values.values[0]))) {
                  uVar16 = 0xffffffffffffffff;
                  do {
                    if (uVar16 == 2) goto LAB_0042a3c4;
                    fVar27 = f.values.values[uVar16 + 2];
                    uVar16 = uVar16 + 1;
                  } while ((fVar27 == 0.0) && (!NAN(fVar27)));
                  if (2 < uVar16) goto LAB_0042a3c4;
                }
                bVar13 = Integrator::Unoccluded((Integrator *)this,(Interaction *)&si,&ls.pLight);
                if (bVar13) {
                  auVar77._0_4_ = f.values.values[0] * beta.values.values[0] * ls.L.values.values[0]
                  ;
                  auVar77._4_4_ = f.values.values[1] * beta.values.values[1] * ls.L.values.values[1]
                  ;
                  auVar77._8_4_ = f.values.values[2] * beta.values.values[2] * ls.L.values.values[2]
                  ;
                  auVar77._12_4_ =
                       f.values.values[3] * beta.values.values[3] * ls.L.values.values[3];
                  fVar27 = (1.0 / auVar24._0_4_) * ls.pdf;
                  auVar28._0_4_ = fVar27 * (lambda->pdf).values[0];
                  auVar28._4_4_ = fVar27 * (lambda->pdf).values[1];
                  auVar28._8_4_ = fVar27 * (lambda->pdf).values[2];
                  auVar28._12_4_ = fVar27 * (lambda->pdf).values[3];
                  uVar16 = vcmpps_avx512vl(auVar28,_DAT_004fb010,4);
                  auVar22 = vdivps_avx512vl(auVar77,auVar28);
                  local_2f8._4_4_ =
                       (float)((uint)((byte)(uVar16 >> 1) & 1) * auVar22._4_4_) +
                       (float)local_2f8._4_4_;
                  local_2f8._0_4_ =
                       (float)((uint)((byte)uVar16 & 1) * auVar22._0_4_) + (float)local_2f8._0_4_;
                  fStack_2f0 = (float)((uint)((byte)(uVar16 >> 2) & 1) * auVar22._8_4_) + fStack_2f0
                  ;
                  fStack_2ec = (float)((uint)((byte)(uVar16 >> 3) & 1) * auVar22._12_4_) +
                               fStack_2ec;
                }
              }
            }
          }
LAB_0042a3c4:
          auVar91 = in_ZMM6._0_16_;
          if (this->sampleBSDF == true) {
            ls.L.values.values._0_8_ =
                 (pSVar18->
                 super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                 ).bits;
            FVar25 = detail::DispatchSplit<8>::operator()
                               ((DispatchSplit<8> *)&f,&ls,(ulong)ls.L.values.values._0_8_ >> 0x30);
            uVar16 = (pSVar18->
                     super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                     ).bits;
            uVar15 = (uint)(ushort)(uVar16 >> 0x30);
            if (uVar16 < 0x5000000000000) {
              if (uVar15 < 3) {
                if (uVar15 == 2) {
                  auVar47._0_8_ =
                       PaddedSobolSampler::Get2D((PaddedSobolSampler *)(uVar16 & 0xffffffffffff));
                  auVar47._8_56_ = extraout_var_10;
                  auVar22 = auVar47._0_16_;
                }
                else {
                  auVar56._0_8_ = HaltonSampler::Get2D((HaltonSampler *)(uVar16 & 0xffffffffffff));
                  auVar56._8_56_ = extraout_var_19;
                  auVar22 = auVar56._0_16_;
                }
              }
              else if ((uVar15 & 6) == 2) {
                auVar52._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)(uVar16 & 0xffffffffffff));
                auVar52._8_56_ = extraout_var_15;
                auVar22 = auVar52._0_16_;
              }
              else {
                auVar58._0_8_ = RandomSampler::Get2D((RandomSampler *)(uVar16 & 0xffffffffffff));
                auVar58._8_56_ = extraout_var_21;
                auVar22 = auVar58._0_16_;
              }
            }
            else {
              uVar15 = uVar15 - 4;
              if (uVar15 < 3) {
                if (uVar15 == 2) {
                  auVar50._0_8_ =
                       StratifiedSampler::Get2D((StratifiedSampler *)(uVar16 & 0xffffffffffff));
                  auVar50._8_56_ = extraout_var_13;
                  auVar22 = auVar50._0_16_;
                }
                else {
                  auVar57._0_8_ = SobolSampler::Get2D((SobolSampler *)(uVar16 & 0xffffffffffff));
                  auVar57._8_56_ = extraout_var_20;
                  auVar22 = auVar57._0_16_;
                }
              }
              else {
                pDVar20 = (DebugMLTSampler *)(uVar16 & 0xffffffffffff);
                if ((uVar15 & 0x7ffffffe) == 2) {
                  auVar53._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar20);
                  auVar53._8_56_ = extraout_var_16;
                  auVar22 = auVar53._0_16_;
                }
                else {
                  local_318._0_4_ = DebugMLTSampler::Get1D(pDVar20);
                  local_318._4_4_ = extraout_XMM0_Db_00;
                  local_318._8_4_ = extraout_XMM0_Dc_00;
                  local_318._12_4_ = extraout_XMM0_Dd_00;
                  auVar59._0_4_ = DebugMLTSampler::Get1D(pDVar20);
                  auVar59._4_60_ = extraout_var_00;
                  auVar22 = vinsertps_avx(local_318,auVar59._0_16_,0x10);
                }
              }
            }
            ls.L.values.values._0_8_ = vmovlps_avx(auVar22);
            woRender_00.super_Tuple3<pbrt::Vector3,_float>.y = fStack_2c4;
            woRender_00.super_Tuple3<pbrt::Vector3,_float>.x = local_2c8;
            woRender_00.super_Tuple3<pbrt::Vector3,_float>.z = local_2d8._0_4_;
            BSDF::Sample_f((BSDFSample *)&f,&bsdf,woRender_00,FVar25,(Point2f *)&ls,Radiance,All);
            uVar11 = uStack_348;
            auVar91 = in_ZMM6._0_16_;
            if (fStack_34c <= 0.0) {
              bVar13 = true;
              iVar14 = local_32c;
              goto LAB_0042abf1;
            }
            auVar29._4_4_ = fStack_34c;
            auVar29._0_4_ = fStack_34c;
            auVar29._8_4_ = fStack_34c;
            auVar29._12_4_ = fStack_34c;
            auVar22 = vfmadd132ss_fma(ZEXT416((uint)si.optionalValue._132_4_),
                                      ZEXT416((uint)((float)si.optionalValue._136_4_ * local_358.z))
                                      ,ZEXT416((uint)local_358.y));
            auVar24 = vfmsub213ss_fma(ZEXT416((uint)local_358.z),
                                      ZEXT416((uint)si.optionalValue._136_4_),
                                      ZEXT416((uint)((float)si.optionalValue._136_4_ * local_358.z))
                                     );
            auVar22 = vfmadd231ss_fma(ZEXT416((uint)(auVar22._0_4_ + auVar24._0_4_)),
                                      ZEXT416((uint)si.optionalValue._128_4_),
                                      ZEXT416((uint)local_358.x));
            uVar89 = auVar22._0_4_;
            auVar78._4_4_ = uVar89;
            auVar78._0_4_ = uVar89;
            auVar78._8_4_ = uVar89;
            auVar78._12_4_ = uVar89;
            auVar5._8_4_ = 0x7fffffff;
            auVar5._0_8_ = 0x7fffffff7fffffff;
            auVar5._12_4_ = 0x7fffffff;
            auVar22 = vandps_avx512vl(auVar78,auVar5);
            auVar79._0_4_ = auVar22._0_4_ * f.values.values[0];
            auVar79._4_4_ = auVar22._4_4_ * f.values.values[1];
            auVar79._8_4_ = auVar22._8_4_ * f.values.values[2];
            auVar79._12_4_ = auVar22._12_4_ * f.values.values[3];
            auVar22 = vdivps_avx(auVar79,auVar29);
            beta.values.values[0] = auVar22._0_4_ * beta.values.values[0];
            beta.values.values[1] = auVar22._4_4_ * beta.values.values[1];
            beta.values.values[2] = auVar22._8_4_ * beta.values.values[2];
            beta.values.values[3] = auVar22._12_4_ * beta.values.values[3];
            Interaction::SpawnRay((RayDifferential *)&ls,(Interaction *)&si,(Vector3f *)&local_358);
            uVar72 = CONCAT44(ls.L.values.values[3],ls.L.values.values[2]);
            uVar74 = CONCAT44(ls.wi.super_Tuple3<pbrt::Vector3,_float>.x,ls.L.values.values[3]);
            uVar87 = CONCAT44(ls.wi.super_Tuple3<pbrt::Vector3,_float>.z,
                              ls.wi.super_Tuple3<pbrt::Vector3,_float>.y);
            uVar15 = (uint)(byte)((byte)uVar11 >> 4);
          }
          else {
            f.values.values._0_12_ = ZEXT812(0);
            bVar13 = BSDF::HasReflection(&bsdf);
            if ((bVar13) && (bVar13 = BSDF::HasTransmission(&bsdf), bVar13)) {
              uVar16 = (pSVar18->
                       super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                       ).bits;
              uVar15 = (uint)(ushort)(uVar16 >> 0x30);
              if (uVar16 < 0x5000000000000) {
                if (uVar15 < 3) {
                  if (uVar15 == 2) {
                    auVar48._0_8_ =
                         PaddedSobolSampler::Get2D((PaddedSobolSampler *)(uVar16 & 0xffffffffffff));
                    auVar48._8_56_ = extraout_var_11;
                    auVar22 = auVar48._0_16_;
                  }
                  else {
                    auVar67._0_8_ = HaltonSampler::Get2D((HaltonSampler *)(uVar16 & 0xffffffffffff))
                    ;
                    auVar67._8_56_ = extraout_var_28;
                    auVar22 = auVar67._0_16_;
                  }
                }
                else if ((uVar15 & 6) == 2) {
                  auVar65._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)(uVar16 & 0xffffffffffff))
                  ;
                  auVar65._8_56_ = extraout_var_26;
                  auVar22 = auVar65._0_16_;
                }
                else {
                  auVar69._0_8_ = RandomSampler::Get2D((RandomSampler *)(uVar16 & 0xffffffffffff));
                  auVar69._8_56_ = extraout_var_30;
                  auVar22 = auVar69._0_16_;
                }
              }
              else {
                uVar15 = uVar15 - 4;
                if (uVar15 < 3) {
                  if (uVar15 == 2) {
                    auVar60._0_8_ =
                         StratifiedSampler::Get2D((StratifiedSampler *)(uVar16 & 0xffffffffffff));
                    auVar60._8_56_ = extraout_var_22;
                    auVar22 = auVar60._0_16_;
                  }
                  else {
                    auVar68._0_8_ = SobolSampler::Get2D((SobolSampler *)(uVar16 & 0xffffffffffff));
                    auVar68._8_56_ = extraout_var_29;
                    auVar22 = auVar68._0_16_;
                  }
                }
                else {
                  pDVar20 = (DebugMLTSampler *)(uVar16 & 0xffffffffffff);
                  if ((uVar15 & 0x7ffffffe) == 2) {
                    auVar66._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar20);
                    auVar66._8_56_ = extraout_var_27;
                    auVar22 = auVar66._0_16_;
                  }
                  else {
                    local_388._0_4_ = DebugMLTSampler::Get1D(pDVar20);
                    local_388._4_4_ = extraout_XMM0_Db_02;
                    local_388._8_4_ = extraout_XMM0_Dc_02;
                    local_388._12_4_ = extraout_XMM0_Dd_02;
                    auVar70._0_4_ = DebugMLTSampler::Get1D(pDVar20);
                    auVar70._4_60_ = extraout_var_02;
                    auVar22 = vinsertps_avx(local_388,auVar70._0_16_,0x10);
                  }
                }
              }
              auVar23 = vfmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar22,ZEXT416(0xc0000000));
              auVar24 = vfnmadd213ss_fma(auVar23,auVar23,SUB6416(ZEXT464(0x3f800000),0));
              auVar24 = vmaxss_avx(auVar24,ZEXT416(0));
              auVar24 = vsqrtss_avx(auVar24,auVar24);
              auVar22 = vmovshdup_avx(auVar22);
              fVar27 = auVar22._0_4_ * 6.2831855;
              fVar26 = cosf(fVar27);
              fVar27 = sinf(fVar27);
              local_308 = auVar23._0_4_;
              auVar22 = vinsertps_avx(ZEXT416((uint)(fVar26 * auVar24._0_4_)),
                                      ZEXT416((uint)(fVar27 * auVar24._0_4_)),0x10);
              uVar72 = vmovlps_avx(auVar22);
              f.values.values[0] = (float)(int)uVar72;
              f.values.values[1] = (float)(int)((ulong)uVar72 >> 0x20);
              local_388 = SUB6416(ZEXT464(0x3da2f983),0);
LAB_0042aab4:
              f.values.values[2] = local_308;
            }
            else {
              uVar16 = (pSVar18->
                       super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                       ).bits;
              uVar15 = (uint)(ushort)(uVar16 >> 0x30);
              if (uVar16 < 0x5000000000000) {
                if (uVar15 < 3) {
                  if (uVar15 == 2) {
                    auVar49._0_8_ =
                         PaddedSobolSampler::Get2D((PaddedSobolSampler *)(uVar16 & 0xffffffffffff));
                    auVar49._8_56_ = extraout_var_12;
                    auVar22 = auVar49._0_16_;
                  }
                  else {
                    auVar61._0_8_ = HaltonSampler::Get2D((HaltonSampler *)(uVar16 & 0xffffffffffff))
                    ;
                    auVar61._8_56_ = extraout_var_23;
                    auVar22 = auVar61._0_16_;
                  }
                }
                else if ((uVar15 & 6) == 2) {
                  auVar54._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)(uVar16 & 0xffffffffffff))
                  ;
                  auVar54._8_56_ = extraout_var_17;
                  auVar22 = auVar54._0_16_;
                }
                else {
                  auVar63._0_8_ = RandomSampler::Get2D((RandomSampler *)(uVar16 & 0xffffffffffff));
                  auVar63._8_56_ = extraout_var_25;
                  auVar22 = auVar63._0_16_;
                }
              }
              else {
                uVar15 = uVar15 - 4;
                if (uVar15 < 3) {
                  if (uVar15 == 2) {
                    auVar51._0_8_ =
                         StratifiedSampler::Get2D((StratifiedSampler *)(uVar16 & 0xffffffffffff));
                    auVar51._8_56_ = extraout_var_14;
                    auVar22 = auVar51._0_16_;
                  }
                  else {
                    auVar62._0_8_ = SobolSampler::Get2D((SobolSampler *)(uVar16 & 0xffffffffffff));
                    auVar62._8_56_ = extraout_var_24;
                    auVar22 = auVar62._0_16_;
                  }
                }
                else {
                  pDVar20 = (DebugMLTSampler *)(uVar16 & 0xffffffffffff);
                  if ((uVar15 & 0x7ffffffe) == 2) {
                    auVar55._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar20);
                    auVar55._8_56_ = extraout_var_18;
                    auVar22 = auVar55._0_16_;
                  }
                  else {
                    local_388._0_4_ = DebugMLTSampler::Get1D(pDVar20);
                    local_388._4_4_ = extraout_XMM0_Db_01;
                    local_388._8_4_ = extraout_XMM0_Dc_01;
                    local_388._12_4_ = extraout_XMM0_Dd_01;
                    auVar64._0_4_ = DebugMLTSampler::Get1D(pDVar20);
                    auVar64._4_60_ = extraout_var_01;
                    auVar22 = vinsertps_avx(local_388,auVar64._0_16_,0x10);
                  }
                }
              }
              auVar24 = vfnmadd213ss_fma(auVar22,auVar22,ZEXT416(0x3f800000));
              auVar24 = vmaxss_avx(auVar24,ZEXT416(0));
              auVar23 = vsqrtss_avx(auVar24,auVar24);
              auVar24 = vmovshdup_avx(auVar22);
              fVar27 = auVar24._0_4_ * 6.2831855;
              fVar26 = cosf(fVar27);
              fVar27 = sinf(fVar27);
              auVar24 = vinsertps_avx(ZEXT416((uint)(fVar26 * auVar23._0_4_)),
                                      ZEXT416((uint)(fVar27 * auVar23._0_4_)),0x10);
              uVar72 = vmovlps_avx(auVar24);
              local_308 = auVar22._0_4_;
              f.values.values[2] = local_308;
              f.values.values[0] = (float)(int)uVar72;
              f.values.values[1] = (float)(int)((ulong)uVar72 >> 0x20);
              bVar13 = BSDF::HasReflection(&bsdf);
              SVar92 = f;
              uVar72 = f.values.values._8_8_;
              if (bVar13) {
                auVar7._4_4_ = fStack_2c4;
                auVar7._0_4_ = local_2c8;
                auVar7._8_4_ = uStack_2c0;
                auVar7._12_4_ = uStack_2bc;
                auVar22 = vmovshdup_avx(auVar7);
                auVar24 = ZEXT416((uint)((float)si.optionalValue._48_4_ * local_2d8._0_4_));
                auVar22 = vfmadd213ss_fma(auVar22,ZEXT416((uint)si.optionalValue._44_4_),auVar24);
                auVar24 = vfmsub231ss_fma(auVar24,ZEXT416((uint)si.optionalValue._48_4_),local_2d8);
                auVar30._8_8_ = 0;
                auVar30._0_4_ = f.values.values[0];
                auVar30._4_4_ = f.values.values[1];
                auVar24 = vfmadd231ss_fma(ZEXT416((uint)(auVar22._0_4_ + auVar24._0_4_)),
                                          ZEXT416((uint)si.optionalValue._40_4_),auVar7);
                auVar22 = vmovshdup_avx(auVar30);
                auVar91 = vfmadd213ss_fma(auVar22,ZEXT416((uint)si.optionalValue._44_4_),
                                          ZEXT416((uint)((float)si.optionalValue._48_4_ *
                                                        f.values.values[2])));
                auVar22 = vfmsub213ss_fma(ZEXT416((uint)si.optionalValue._48_4_),
                                          ZEXT416((uint)f.values.values[2]),
                                          ZEXT416((uint)((float)si.optionalValue._48_4_ *
                                                        f.values.values[2])));
                auVar22 = vfmadd231ss_fma(ZEXT416((uint)(auVar91._0_4_ + auVar22._0_4_)),auVar30,
                                          ZEXT416((uint)si.optionalValue._40_4_));
                local_308 = f.values.values[2];
                if (0.0 <= auVar24._0_4_ * auVar22._0_4_) goto LAB_0042a8d9;
LAB_0042a97c:
                f.values.values._8_8_ = uVar72;
                auVar31._0_8_ = f.values.values._0_8_ ^ 0x8000000080000000;
                auVar31._8_4_ = 0x80000000;
                local_308 = -local_308;
                auVar31._12_4_ = 0x80000000;
                uVar72 = vmovlps_avx(auVar31);
                f.values.values[0] = (float)(int)uVar72;
                f.values.values[1] = (float)(int)((ulong)uVar72 >> 0x20);
                local_388 = SUB6416(ZEXT464(0x3e22f983),0);
                goto LAB_0042aab4;
              }
LAB_0042a8d9:
              f = SVar92;
              bVar13 = BSDF::HasTransmission(&bsdf);
              SVar92 = f;
              uVar72 = f.values.values._8_8_;
              if (bVar13) {
                auVar91._4_4_ = fStack_2c4;
                auVar91._0_4_ = local_2c8;
                auVar91._8_4_ = uStack_2c0;
                auVar91._12_4_ = uStack_2bc;
                auVar22 = vmovshdup_avx(auVar91);
                auVar23 = ZEXT416((uint)((float)si.optionalValue._48_4_ * local_2d8._0_4_));
                auVar24 = vfmsub213ss_fma(local_2d8,ZEXT416((uint)si.optionalValue._48_4_),auVar23);
                auVar22 = vfmadd213ss_fma(auVar22,ZEXT416((uint)si.optionalValue._44_4_),auVar23);
                auVar32._8_8_ = 0;
                auVar32._0_4_ = f.values.values[0];
                auVar32._4_4_ = f.values.values[1];
                auVar23 = vfmsub213ss_fma(ZEXT416((uint)si.optionalValue._48_4_),
                                          ZEXT416((uint)f.values.values[2]),
                                          ZEXT416((uint)((float)si.optionalValue._48_4_ *
                                                        f.values.values[2])));
                auVar24 = vfmadd231ss_fma(ZEXT416((uint)(auVar22._0_4_ + auVar24._0_4_)),
                                          ZEXT416((uint)si.optionalValue._40_4_),auVar91);
                auVar22 = vmovshdup_avx(auVar32);
                auVar22 = vfmadd213ss_fma(auVar22,ZEXT416((uint)si.optionalValue._44_4_),
                                          ZEXT416((uint)((float)si.optionalValue._48_4_ *
                                                        f.values.values[2])));
                auVar22 = vfmadd231ss_fma(ZEXT416((uint)(auVar22._0_4_ + auVar23._0_4_)),auVar32,
                                          ZEXT416((uint)si.optionalValue._40_4_));
                local_308 = f.values.values[2];
                if (0.0 < auVar24._0_4_ * auVar22._0_4_) goto LAB_0042a97c;
              }
              local_388 = SUB6416(ZEXT464(0x3e22f983),0);
              local_308 = f.values.values[2];
              f = SVar92;
            }
            SVar92.values.values = f.values.values;
            woRender_01.super_Tuple3<pbrt::Vector3,_float>.y = fStack_2c4;
            woRender_01.super_Tuple3<pbrt::Vector3,_float>.x = local_2c8;
            woRender_01.super_Tuple3<pbrt::Vector3,_float>.z = local_2d8._0_4_;
            auVar88 = ZEXT856((ulong)local_2d8._8_8_);
            auVar73 = ZEXT856(CONCAT44(uStack_2bc,uStack_2c0));
            wiRender_00.super_Tuple3<pbrt::Vector3,_float>.z = local_308;
            wiRender_00.super_Tuple3<pbrt::Vector3,_float>.x = f.values.values[0];
            wiRender_00.super_Tuple3<pbrt::Vector3,_float>.y = f.values.values[1];
            f = (SampledSpectrum)(SampledSpectrum)SVar92.values.values;
            SVar92 = BSDF::f(&bsdf,woRender_01,wiRender_00,Radiance);
            auVar86._0_8_ = SVar92.values.values._8_8_;
            auVar86._8_56_ = auVar88;
            auVar71._0_8_ = SVar92.values.values._0_8_;
            auVar71._8_56_ = auVar73;
            auVar22 = vmovlhps_avx(auVar71._0_16_,auVar86._0_16_);
            auVar24 = vfmadd132ss_fma(ZEXT416((uint)si.optionalValue._132_4_),
                                      ZEXT416((uint)((float)si.optionalValue._136_4_ *
                                                    f.values.values[2])),
                                      ZEXT416((uint)f.values.values[1]));
            auVar23 = vfmsub213ss_fma(ZEXT416((uint)f.values.values[2]),
                                      ZEXT416((uint)si.optionalValue._136_4_),
                                      ZEXT416((uint)((float)si.optionalValue._136_4_ *
                                                    f.values.values[2])));
            auVar24 = vfmadd231ss_fma(ZEXT416((uint)(auVar24._0_4_ + auVar23._0_4_)),
                                      ZEXT416((uint)si.optionalValue._128_4_),
                                      ZEXT416((uint)f.values.values[0]));
            auVar90._4_4_ = local_388._0_4_;
            auVar90._0_4_ = local_388._0_4_;
            auVar90._8_4_ = local_388._0_4_;
            auVar90._12_4_ = local_388._0_4_;
            auVar80._0_4_ = auVar24._0_4_;
            auVar80._4_4_ = auVar80._0_4_;
            auVar80._8_4_ = auVar80._0_4_;
            auVar80._12_4_ = auVar80._0_4_;
            auVar6._8_4_ = 0x7fffffff;
            auVar6._0_8_ = 0x7fffffff7fffffff;
            auVar6._12_4_ = 0x7fffffff;
            auVar24 = vandps_avx512vl(auVar80,auVar6);
            auVar33._0_4_ = auVar24._0_4_ * auVar22._0_4_;
            auVar33._4_4_ = auVar24._4_4_ * auVar22._4_4_;
            auVar33._8_4_ = auVar24._8_4_ * auVar22._8_4_;
            auVar33._12_4_ = auVar24._12_4_ * auVar22._12_4_;
            auVar22 = vdivps_avx(auVar33,auVar90);
            beta.values.values[0] = auVar22._0_4_ * beta.values.values[0];
            beta.values.values[1] = auVar22._4_4_ * beta.values.values[1];
            beta.values.values[2] = auVar22._8_4_ * beta.values.values[2];
            beta.values.values[3] = auVar22._12_4_ * beta.values.values[3];
            Interaction::SpawnRay((RayDifferential *)&ls,(Interaction *)&si,(Vector3f *)&f);
            uVar72 = CONCAT44(ls.L.values.values[3],ls.L.values.values[2]);
            uVar74 = CONCAT44(ls.wi.super_Tuple3<pbrt::Vector3,_float>.x,ls.L.values.values[3]);
            uVar87 = CONCAT44(ls.wi.super_Tuple3<pbrt::Vector3,_float>.z,
                              ls.wi.super_Tuple3<pbrt::Vector3,_float>.y);
            uVar15 = 0;
          }
          auVar12 = (undefined1  [20])ls.pLight._32_20_;
          (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar74;
          (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y =
               (float)(int)((ulong)uVar74 >> 0x20);
          *(undefined8 *)&(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z = uVar87;
          (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x = ls.L.values.values[0];
          (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y = ls.L.values.values[1];
          *(undefined8 *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z = uVar72;
          (ray->super_Ray).medium.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits = (uintptr_t)
                  ls.light.
                  super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                  .bits;
          IVar8.high = ls.pLight.pi.super_Point3<pbrt::Interval<float>_>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
          IVar8.low = ls.pLight.pi.super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low;
          auVar9._4_4_ = ls.pLight.time;
          auVar9._8_4_ = ls.pLight.wo.super_Tuple3<pbrt::Vector3,_float>.x;
          auVar9._0_4_ = ls.pLight.pi.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
          auVar9._12_4_ = ls.pLight.wo.super_Tuple3<pbrt::Vector3,_float>.y;
          auVar9._16_4_ = ls.pLight.wo.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar9._20_4_ = ls.pLight.n.super_Tuple3<pbrt::Normal3,_float>.x;
          auVar9._24_4_ = ls.pLight.n.super_Tuple3<pbrt::Normal3,_float>.y;
          auVar9._28_4_ = ls.pLight.n.super_Tuple3<pbrt::Normal3,_float>.z;
          *(undefined1 (*) [32])&local_2b8[2].high = auVar9;
          *local_2b8 = ls.pLight.pi.super_Point3<pbrt::Interval<float>_>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
          local_2b8[1] = ls.pLight.pi.super_Point3<pbrt::Interval<float>_>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
          local_2b8[2] = IVar8;
          local_2b8[3].low = ls.pLight.time;
          local_2b8[3].high = ls.pLight.wo.super_Tuple3<pbrt::Vector3,_float>.x;
          in_ZMM6 = ZEXT1664(auVar91);
          ls.pLight._32_20_ = auVar12;
          FVar25 = SampledSpectrum::y(&beta,lambda);
          ls.L.values.values[0] = FVar25;
          auVar10._12_4_ = 0;
          auVar10._0_4_ = f.values.values[1];
          auVar10._4_4_ = f.values.values[2];
          auVar10._8_4_ = f.values.values[3];
          f.values.values = (array<float,_4>)(auVar10 << 0x20);
          if (FVar25 < 0.0) {
            LogFatal<char_const(&)[15],char_const(&)[4],char_const(&)[15],float&,char_const(&)[4],float&>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators.cpp"
                       ,0x214,"Check failed: %s >= %s with %s = %s, %s = %s",
                       (char (*) [15])"beta.y(lambda)",(char (*) [4])"0.f",
                       (char (*) [15])"beta.y(lambda)",(float *)&ls,(char (*) [4])"0.f",(float *)&f)
            ;
          }
          local_388._0_4_ = uVar15;
        }
        bVar13 = false;
        iVar14 = local_32c;
      }
    }
LAB_0042abf1:
  } while (!bVar13);
LAB_0042abfc:
  auVar22 = vshufpd_avx(_local_2f8,_local_2f8,1);
  SVar92.values.values._0_8_ = local_2f8;
  SVar92.values.values._8_8_ = auVar22._0_8_;
  return (SampledSpectrum)SVar92.values.values;
}

Assistant:

SampledSpectrum SimplePathIntegrator::Li(RayDifferential ray, SampledWavelengths &lambda,
                                         SamplerHandle sampler,
                                         ScratchBuffer &scratchBuffer,
                                         VisibleSurface *visibleSurface) const {
    SampledSpectrum L(0.f), beta(1.f);
    bool specularBounce = true;
    int depth = 0;

    while (beta) {
        // Find next _SimplePathIntegrator_ path vertex and accumulate contribution
        // Intersect _ray_ with scene
        pstd::optional<ShapeIntersection> si = Intersect(ray);

        // Account for infinite lights if ray has no intersection
        if (!si) {
            if (!sampleLights || specularBounce)
                for (const auto &light : infiniteLights)
                    L += SafeDiv(beta * light.Le(ray, lambda), lambda.PDF());
            break;
        }

        // Account for emsisive surface if light wasn't sampled
        SurfaceInteraction &isect = si->intr;
        if (!sampleLights || specularBounce)
            L += SafeDiv(beta * isect.Le(-ray.d, lambda), lambda.PDF());

        // End path if maximum depth reached
        if (depth++ == maxDepth)
            break;

        // Compute scattering functions and skip over medium boundaries
        BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
        if (!bsdf) {
            isect.SkipIntersection(&ray, si->tHit);
            continue;
        }

        // Sample direct illumination if _sampleLights_ is true
        Vector3f wo = -ray.d;
        if (sampleLights) {
            pstd::optional<SampledLight> sampledLight =
                lightSampler.Sample(sampler.Get1D());
            if (sampledLight) {
                // Sample point on _sampledLight_ to estimate direct illumination
                Point2f uLight = sampler.Get2D();
                LightLiSample ls = sampledLight->light.SampleLi(isect, uLight, lambda);
                if (ls && ls.L) {
                    // Evaluate BSDF for light and possibly add scattered radiance
                    Vector3f wi = ls.wi;
                    SampledSpectrum f = bsdf.f(wo, wi) * AbsDot(wi, isect.shading.n);
                    if (f && Unoccluded(isect, ls.pLight))
                        L += SafeDiv(beta * f * ls.L,
                                     sampledLight->pdf * ls.pdf * lambda.PDF());
                }
            }
        }

        // Sample outoing direction at intersection to continue path
        if (sampleBSDF) {
            // Sample BSDF for new path direction
            Float u = sampler.Get1D();
            BSDFSample bs = bsdf.Sample_f(wo, u, sampler.Get2D());
            if (!bs)
                break;
            beta *= bs.f * AbsDot(bs.wi, isect.shading.n) / bs.pdf;
            specularBounce = bs.IsSpecular();
            ray = isect.SpawnRay(bs.wi);

        } else {
            // Uniformly sample sphere or hemisphere to get new path direction
            Float pdf;
            Vector3f wi;
            if (bsdf.HasReflection() && bsdf.HasTransmission()) {
                wi = SampleUniformSphere(sampler.Get2D());
                pdf = UniformSpherePDF();
            } else {
                wi = SampleUniformHemisphere(sampler.Get2D());
                pdf = UniformHemispherePDF();
                if (bsdf.HasReflection() && Dot(wo, isect.n) * Dot(wi, isect.n) < 0)
                    wi = -wi;
                else if (bsdf.HasTransmission() &&
                         Dot(wo, isect.n) * Dot(wi, isect.n) > 0)
                    wi = -wi;
            }
            beta *= bsdf.f(wo, wi) * AbsDot(wi, isect.shading.n) / pdf;
            specularBounce = false;
            ray = isect.SpawnRay(wi);
        }

        CHECK_GE(beta.y(lambda), 0.f);
        DCHECK(!IsInf(beta.y(lambda)));
    }
    return L;
}